

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O0

void __thiscall muduo::LogFile::~LogFile(LogFile *this)

{
  string *in_RDI;
  unique_ptr<muduo::FileUtil::AppendFile,_std::default_delete<muduo::FileUtil::AppendFile>_>
  *unaff_retaddr;
  
  std::unique_ptr<muduo::FileUtil::AppendFile,_std::default_delete<muduo::FileUtil::AppendFile>_>::
  ~unique_ptr(unaff_retaddr);
  std::unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_>::~unique_ptr
            ((unique_ptr<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_> *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

LogFile::~LogFile() = default;